

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall
PrecomputedTransactionData::Init<CTransaction>
          (PrecomputedTransactionData *this,CTransaction *txTo,
          vector<CTxOut,_std::allocator<CTxOut>_> *spent_outputs,bool force)

{
  vector<CTxOut,_std::allocator<CTxOut>_> *outputs_spent;
  pointer pCVar1;
  pointer pCVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  byte bVar6;
  size_type *psVar7;
  pointer pCVar8;
  pointer *ppvVar9;
  byte bVar10;
  long in_FS_OFFSET;
  bool bVar11;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_spent_outputs_ready == true) {
    __assert_fail("!m_spent_outputs_ready",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                  ,0x578,
                  "void PrecomputedTransactionData::Init(const T &, std::vector<CTxOut> &&, bool) [T = CTransaction]"
                 );
  }
  outputs_spent = &this->m_spent_outputs;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::_M_move_assign(outputs_spent,spent_outputs);
  pCVar1 = (this->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (this->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar1 == pCVar2) {
    pCVar8 = (txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar4 = this->m_spent_outputs_ready;
    uVar3 = ((long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pCVar8) / 0x68;
  }
  else {
    pCVar8 = (txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = ((long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pCVar8) / 0x68;
    if (((long)pCVar2 - (long)pCVar1) / 0x28 != uVar3) {
      __assert_fail("m_spent_outputs.size() == txTo.vin.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                    ,0x57c,
                    "void PrecomputedTransactionData::Init(const T &, std::vector<CTxOut> &&, bool) [T = CTransaction]"
                   );
    }
    this->m_spent_outputs_ready = true;
    bVar4 = 1;
  }
  psVar7 = &(pCVar1->scriptPubKey).super_CScriptBase._size;
  ppvVar9 = (pointer *)((long)&(pCVar8->scriptWitness).stack + 8);
  uVar5 = 0;
  bVar6 = force;
  while ((uVar5 < uVar3 && ((bVar6 & force & 1) == 0))) {
    bVar11 = ((_Vector_impl_data *)(ppvVar9 + -1))->_M_start != *ppvVar9;
    bVar10 = bVar6;
    if (bVar11) {
      bVar10 = 1;
    }
    if ((((bVar11 & bVar4) == 1) && (bVar10 = 1, *psVar7 == 0x3f)) &&
       (*(((CScriptBase *)(psVar7 + -7))->_union).indirect_contents.indirect == 'Q')) {
      force = true;
joined_r0x0064c217:
      if ((bVar6 & 1) != 0) break;
    }
    else {
      bVar6 = bVar10;
      if ((force & 1U) != 0) goto joined_r0x0064c217;
    }
    uVar5 = uVar5 + 1;
    psVar7 = psVar7 + 10;
    ppvVar9 = ppvVar9 + 0xd;
  }
  if (((bVar6 & 1) != 0) || ((force & 1U) != 0)) {
    anon_unknown.dwarf_238fe0a::GetPrevoutsSHA256<CTransaction>(&local_58,txTo);
    *(undefined8 *)((this->m_prevouts_single_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_58.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)((this->m_prevouts_single_hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_58.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)(this->m_prevouts_single_hash).super_base_blob<256U>.m_data._M_elems =
         local_58.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)((this->m_prevouts_single_hash).super_base_blob<256U>.m_data._M_elems + 8) =
         local_58.super_base_blob<256U>.m_data._M_elems._8_8_;
    anon_unknown.dwarf_238fe0a::GetSequencesSHA256<CTransaction>(&local_58,txTo);
    *(undefined8 *)((this->m_sequences_single_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_58.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)((this->m_sequences_single_hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_58.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)(this->m_sequences_single_hash).super_base_blob<256U>.m_data._M_elems =
         local_58.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)((this->m_sequences_single_hash).super_base_blob<256U>.m_data._M_elems + 8) =
         local_58.super_base_blob<256U>.m_data._M_elems._8_8_;
    anon_unknown.dwarf_238fe0a::GetOutputsSHA256<CTransaction>(&local_58,txTo);
    *(undefined8 *)((this->m_outputs_single_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_58.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)((this->m_outputs_single_hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_58.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)(this->m_outputs_single_hash).super_base_blob<256U>.m_data._M_elems =
         local_58.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)((this->m_outputs_single_hash).super_base_blob<256U>.m_data._M_elems + 8) =
         local_58.super_base_blob<256U>.m_data._M_elems._8_8_;
    if ((bVar6 & 1) != 0) {
      SHA256Uint256(&local_58,&this->m_prevouts_single_hash);
      *(undefined8 *)((this->hashPrevouts).super_base_blob<256U>.m_data._M_elems + 0x10) =
           local_58.super_base_blob<256U>.m_data._M_elems._16_8_;
      *(undefined8 *)((this->hashPrevouts).super_base_blob<256U>.m_data._M_elems + 0x18) =
           local_58.super_base_blob<256U>.m_data._M_elems._24_8_;
      *(undefined8 *)(this->hashPrevouts).super_base_blob<256U>.m_data._M_elems =
           local_58.super_base_blob<256U>.m_data._M_elems._0_8_;
      *(undefined8 *)((this->hashPrevouts).super_base_blob<256U>.m_data._M_elems + 8) =
           local_58.super_base_blob<256U>.m_data._M_elems._8_8_;
      SHA256Uint256(&local_58,&this->m_sequences_single_hash);
      *(undefined8 *)((this->hashSequence).super_base_blob<256U>.m_data._M_elems + 0x10) =
           local_58.super_base_blob<256U>.m_data._M_elems._16_8_;
      *(undefined8 *)((this->hashSequence).super_base_blob<256U>.m_data._M_elems + 0x18) =
           local_58.super_base_blob<256U>.m_data._M_elems._24_8_;
      *(undefined8 *)(this->hashSequence).super_base_blob<256U>.m_data._M_elems =
           local_58.super_base_blob<256U>.m_data._M_elems._0_8_;
      *(undefined8 *)((this->hashSequence).super_base_blob<256U>.m_data._M_elems + 8) =
           local_58.super_base_blob<256U>.m_data._M_elems._8_8_;
      SHA256Uint256(&local_58,&this->m_outputs_single_hash);
      *(undefined8 *)((this->hashOutputs).super_base_blob<256U>.m_data._M_elems + 0x10) =
           local_58.super_base_blob<256U>.m_data._M_elems._16_8_;
      *(undefined8 *)((this->hashOutputs).super_base_blob<256U>.m_data._M_elems + 0x18) =
           local_58.super_base_blob<256U>.m_data._M_elems._24_8_;
      *(undefined8 *)(this->hashOutputs).super_base_blob<256U>.m_data._M_elems =
           local_58.super_base_blob<256U>.m_data._M_elems._0_8_;
      *(undefined8 *)((this->hashOutputs).super_base_blob<256U>.m_data._M_elems + 8) =
           local_58.super_base_blob<256U>.m_data._M_elems._8_8_;
      this->m_bip143_segwit_ready = true;
    }
  }
  if (((force & 1U) != 0) && (this->m_spent_outputs_ready == true)) {
    anon_unknown.dwarf_238fe0a::GetSpentAmountsSHA256(&local_58,outputs_spent);
    *(undefined8 *)
     ((this->m_spent_amounts_single_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_58.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)
     ((this->m_spent_amounts_single_hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_58.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)(this->m_spent_amounts_single_hash).super_base_blob<256U>.m_data._M_elems =
         local_58.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)((this->m_spent_amounts_single_hash).super_base_blob<256U>.m_data._M_elems + 8) =
         local_58.super_base_blob<256U>.m_data._M_elems._8_8_;
    anon_unknown.dwarf_238fe0a::GetSpentScriptsSHA256(&local_58,outputs_spent);
    *(undefined8 *)
     ((this->m_spent_scripts_single_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_58.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)
     ((this->m_spent_scripts_single_hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_58.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)(this->m_spent_scripts_single_hash).super_base_blob<256U>.m_data._M_elems =
         local_58.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)((this->m_spent_scripts_single_hash).super_base_blob<256U>.m_data._M_elems + 8) =
         local_58.super_base_blob<256U>.m_data._M_elems._8_8_;
    this->m_bip341_taproot_ready = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PrecomputedTransactionData::Init(const T& txTo, std::vector<CTxOut>&& spent_outputs, bool force)
{
    assert(!m_spent_outputs_ready);

    m_spent_outputs = std::move(spent_outputs);
    if (!m_spent_outputs.empty()) {
        assert(m_spent_outputs.size() == txTo.vin.size());
        m_spent_outputs_ready = true;
    }

    // Determine which precomputation-impacting features this transaction uses.
    bool uses_bip143_segwit = force;
    bool uses_bip341_taproot = force;
    for (size_t inpos = 0; inpos < txTo.vin.size() && !(uses_bip143_segwit && uses_bip341_taproot); ++inpos) {
        if (!txTo.vin[inpos].scriptWitness.IsNull()) {
            if (m_spent_outputs_ready && m_spent_outputs[inpos].scriptPubKey.size() == 2 + WITNESS_V1_TAPROOT_SIZE &&
                m_spent_outputs[inpos].scriptPubKey[0] == OP_1) {
                // Treat every witness-bearing spend with 34-byte scriptPubKey that starts with OP_1 as a Taproot
                // spend. This only works if spent_outputs was provided as well, but if it wasn't, actual validation
                // will fail anyway. Note that this branch may trigger for scriptPubKeys that aren't actually segwit
                // but in that case validation will fail as SCRIPT_ERR_WITNESS_UNEXPECTED anyway.
                uses_bip341_taproot = true;
            } else {
                // Treat every spend that's not known to native witness v1 as a Witness v0 spend. This branch may
                // also be taken for unknown witness versions, but it is harmless, and being precise would require
                // P2SH evaluation to find the redeemScript.
                uses_bip143_segwit = true;
            }
        }
        if (uses_bip341_taproot && uses_bip143_segwit) break; // No need to scan further if we already need all.
    }

    if (uses_bip143_segwit || uses_bip341_taproot) {
        // Computations shared between both sighash schemes.
        m_prevouts_single_hash = GetPrevoutsSHA256(txTo);
        m_sequences_single_hash = GetSequencesSHA256(txTo);
        m_outputs_single_hash = GetOutputsSHA256(txTo);
    }
    if (uses_bip143_segwit) {
        hashPrevouts = SHA256Uint256(m_prevouts_single_hash);
        hashSequence = SHA256Uint256(m_sequences_single_hash);
        hashOutputs = SHA256Uint256(m_outputs_single_hash);
        m_bip143_segwit_ready = true;
    }
    if (uses_bip341_taproot && m_spent_outputs_ready) {
        m_spent_amounts_single_hash = GetSpentAmountsSHA256(m_spent_outputs);
        m_spent_scripts_single_hash = GetSpentScriptsSHA256(m_spent_outputs);
        m_bip341_taproot_ready = true;
    }
}